

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u16 computeNumericType(Mem *pMem)

{
  int iVar1;
  MemValue in_RAX;
  sqlite3_int64 ix;
  MemValue local_18;
  
  local_18 = in_RAX;
  if ((pMem->flags & 0x4000) != 0) {
    sqlite3VdbeMemExpandBlob(pMem);
  }
  iVar1 = sqlite3AtoF(pMem->z,(double *)pMem,pMem->n,pMem->enc);
  if (iVar1 < 1) {
    if (iVar1 != 0) {
      return 8;
    }
    iVar1 = sqlite3Atoi64(pMem->z,&local_18.i,pMem->n,pMem->enc);
    if (1 < iVar1) {
      return 8;
    }
  }
  else {
    if (iVar1 != 1) {
      return 8;
    }
    iVar1 = sqlite3Atoi64(pMem->z,&local_18.i,pMem->n,pMem->enc);
    if (iVar1 != 0) {
      return 8;
    }
  }
  pMem->u = local_18;
  return 4;
}

Assistant:

static u16 SQLITE_NOINLINE computeNumericType(Mem *pMem){
  int rc;
  sqlite3_int64 ix;
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal))==0 );
  assert( (pMem->flags & (MEM_Str|MEM_Blob))!=0 );
  ExpandBlob(pMem);
  rc = sqlite3AtoF(pMem->z, &pMem->u.r, pMem->n, pMem->enc);
  if( rc<=0 ){
    if( rc==0 && sqlite3Atoi64(pMem->z, &ix, pMem->n, pMem->enc)<=1 ){
      pMem->u.i = ix;
      return MEM_Int;
    }else{
      return MEM_Real;
    }
  }else if( rc==1 && sqlite3Atoi64(pMem->z, &ix, pMem->n, pMem->enc)==0 ){
    pMem->u.i = ix;
    return MEM_Int;
  }
  return MEM_Real;
}